

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O2

Table * __thiscall wasm::Module::getTable(Module *this,Name name)

{
  mapped_type pTVar1;
  mapped_type *ppTVar2;
  string *in_R8;
  Name name_00;
  string local_50 [39];
  allocator<char> local_29;
  
  name_00.super_IString.str._M_len = name.super_IString.str._M_str;
  std::__cxx11::string::string<std::allocator<char>>(local_50,"getTable",&local_29);
  name_00.super_IString.str._M_str = (char *)local_50;
  ppTVar2 = getModuleElement<std::unordered_map<wasm::Name,wasm::Table*,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Table*>>>>
                      ((wasm *)&this->tablesMap,name.super_IString.str._M_len,name_00,in_R8);
  pTVar1 = *ppTVar2;
  std::__cxx11::string::~string(local_50);
  return pTVar1;
}

Assistant:

Table* Module::getTable(Name name) {
  return getModuleElement(tablesMap, name, "getTable");
}